

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerBase.cpp
# Opt level: O3

void __thiscall
helics::BrokerBase::loadInfoFromJson(BrokerBase *this,string *jsonString,bool runArgParser)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer __s;
  bool bVar2;
  int iVar3;
  int iVar4;
  undefined8 uVar5;
  value_t vVar6;
  json_value jVar7;
  const_iterator cVar8;
  reference pvVar9;
  void *pvVar10;
  bool bVar11;
  bool bVar12;
  shared_ptr<helics::helicsCLI11App> sVar13;
  shared_ptr<helics::helicsCLI11App> app;
  json doc;
  shared_ptr<helics::helicsCLI11App> sApp;
  istringstream jstringHelics;
  istringstream jstringHelicsSub;
  ifstream file;
  undefined1 local_5a0 [20];
  __atomic_base<int> local_58c;
  data local_588;
  undefined1 local_578 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_560;
  _Alloc_hider local_550;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_548 [3];
  ios_base local_4d0 [264];
  data local_3c8;
  undefined1 local_3b8 [16];
  pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3a8 [2];
  ios_base local_340 [264];
  Option *local_238 [15];
  ios_base local_1c0 [400];
  
  local_588.m_type = null;
  local_588.m_value.object = (object_t *)0x0;
  fileops::loadJson((fileops *)&local_3c8,(string *)jsonString);
  jVar7 = local_588.m_value;
  vVar6 = local_588.m_type;
  local_588.m_type = local_3c8.m_type;
  local_3c8.m_type = vVar6;
  local_588.m_value = local_3c8.m_value;
  local_3c8.m_value.string = jVar7.string;
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data(&local_3c8);
  if (local_588.m_type == object) {
    cVar8 = std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
            ::_M_find_tr<char[7],void>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                        *)local_588.m_value.object,(char (*) [7])0x419c74);
    bVar11 = (_Rb_tree_header *)cVar8._M_node ==
             &((local_588.m_value.object)->_M_t)._M_impl.super__Rb_tree_header;
    bVar2 = !bVar11;
    if (bVar11) {
      bVar11 = false;
LAB_002e792e:
      bVar12 = false;
    }
    else {
      pvVar9 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&local_588,"helics");
      if ((pvVar9->m_data).m_type == object) {
        cVar8 = std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                ::_M_find_tr<char[7],void>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                            *)(pvVar9->m_data).m_value.object,(char (*) [7])0x419c74);
        bVar11 = (_Rb_tree_header *)cVar8._M_node !=
                 &(((pvVar9->m_data).m_value.object)->_M_t)._M_impl.super__Rb_tree_header;
      }
      else {
        bVar11 = false;
      }
      pvVar9 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&local_588,"helics");
      if ((pvVar9->m_data).m_type != object) goto LAB_002e792e;
      cVar8 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
              ::_M_find_tr<char[7],void>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                          *)(pvVar9->m_data).m_value.object,(char (*) [7])0x4207b2);
      bVar12 = (_Rb_tree_header *)cVar8._M_node !=
               &(((pvVar9->m_data).m_value.object)->_M_t)._M_impl.super__Rb_tree_header;
    }
    if (local_588.m_type != object) goto LAB_002e7963;
    cVar8 = std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
            ::_M_find_tr<char[7],void>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                        *)local_588.m_value.object,(char (*) [7])0x4207b2);
    local_58c._M_i =
         (__int_type)
         CONCAT71((int7)((ulong)cVar8._M_node >> 8),
                  (_Rb_tree_header *)cVar8._M_node !=
                  &((local_588.m_value.object)->_M_t)._M_impl.super__Rb_tree_header);
  }
  else {
    bVar12 = false;
    bVar11 = false;
    bVar2 = false;
LAB_002e7963:
    local_58c._M_i = 0;
  }
  if (!runArgParser) goto LAB_002e8232;
  sVar13 = generateBaseCLI((BrokerBase *)local_5a0);
  (*this->_vptr_BrokerBase[8])
            (local_560._M_local_buf + 8,this,
             sVar13.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi._M_pi);
  local_578._16_8_ = local_560._8_8_;
  local_560._M_allocated_capacity = (size_type)local_550._M_p;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_550._M_p !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_550._M_p + 8) = *(int *)(local_550._M_p + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_550._M_p + 8) = *(int *)(local_550._M_p + 8) + 1;
    }
  }
  CLI::App::add_subcommand((App *)local_5a0._0_8_,(App_p *)(local_578 + 0x10));
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_560._M_allocated_capacity !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_560._M_allocated_capacity);
  }
  *(bool *)(local_5a0._0_8_ + 0x48) = true;
  if (jsonString->_M_string_length == 0) {
LAB_002e7a15:
    std::ifstream::ifstream(local_238,(string *)jsonString,_S_in);
    uVar5 = local_5a0._0_8_;
    if (*(uint32_t *)(local_5a0._0_8_ + 0x2e4) == 0) {
      CLI::App::_validate((App *)local_5a0._0_8_);
      CLI::App::_configure((App *)uVar5);
    }
    CLI::App::_parse_stream((App *)uVar5,(istream *)local_238);
    CLI::App::run_callback((App *)uVar5,false,false);
    iVar3 = (int)(istream *)local_238;
    if (bVar2) {
      std::ios::clear((int)local_238[0][-1].proc_results_.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish + iVar3);
      std::istream::seekg(local_238,0,0);
      CLI::App::get_config_formatter_base((App *)local_3b8);
      uVar5 = local_3b8._0_8_;
      paVar1 = &local_548[0].field_2;
      local_548[0]._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_548,"helics","");
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(uVar5 + 0x30),
                local_548);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_548[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_548[0]._M_dataplus._M_p,
                        (ulong)(local_548[0].field_2._M_allocated_capacity + 1));
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b8._8_8_);
      }
      uVar5 = local_5a0._0_8_;
      if (*(uint32_t *)(local_5a0._0_8_ + 0x2e4) == 0) {
        CLI::App::_validate((App *)local_5a0._0_8_);
        CLI::App::_configure((App *)uVar5);
      }
      CLI::App::_parse_stream((App *)uVar5,(istream *)local_238);
      CLI::App::run_callback((App *)uVar5,false,false);
      iVar4 = (int)(istream *)local_238;
      if (bVar11) {
        std::ios::clear((int)local_238[0][-1].proc_results_.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish + iVar4);
        std::istream::seekg(local_238,0,0);
        CLI::App::get_config_formatter_base((App *)local_3b8);
        uVar5 = local_3b8._0_8_;
        local_548[0]._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_548,"helics.helics","");
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (uVar5 + 0x30),local_548);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_548[0]._M_dataplus._M_p != paVar1) {
          operator_delete(local_548[0]._M_dataplus._M_p,
                          (ulong)(local_548[0].field_2._M_allocated_capacity + 1));
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b8._8_8_);
        }
        uVar5 = local_5a0._0_8_;
        if (*(uint32_t *)(local_5a0._0_8_ + 0x2e4) == 0) {
          CLI::App::_validate((App *)local_5a0._0_8_);
          CLI::App::_configure((App *)uVar5);
        }
        CLI::App::_parse_stream((App *)uVar5,(istream *)local_238);
        CLI::App::run_callback((App *)uVar5,false,false);
      }
      if (bVar12) {
        std::ios::clear(iVar4 + (int)local_238[0][-1].proc_results_.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish);
        std::istream::seekg(local_238,0,0);
        CLI::App::get_config_formatter_base((App *)local_3b8);
        uVar5 = local_3b8._0_8_;
        local_548[0]._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_548,"helics.broker","");
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (uVar5 + 0x30),local_548);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_548[0]._M_dataplus._M_p != paVar1) {
          operator_delete(local_548[0]._M_dataplus._M_p,
                          (ulong)(local_548[0].field_2._M_allocated_capacity + 1));
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b8._8_8_);
        }
        uVar5 = local_5a0._0_8_;
        if (*(uint32_t *)(local_5a0._0_8_ + 0x2e4) == 0) {
          CLI::App::_validate((App *)local_5a0._0_8_);
          CLI::App::_configure((App *)uVar5);
        }
        CLI::App::_parse_stream((App *)uVar5,(istream *)local_238);
        CLI::App::run_callback((App *)uVar5,false,false);
      }
    }
    if ((char)local_58c._M_i != '\0') {
      std::ios::clear(iVar3 + (int)local_238[0][-1].proc_results_.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish);
      std::istream::seekg(local_238,0,0);
      CLI::App::get_config_formatter_base((App *)local_3b8);
      uVar5 = local_3b8._0_8_;
      local_548[0]._M_dataplus._M_p = (pointer)&local_548[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_548,"broker","");
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(uVar5 + 0x30),
                local_548);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_548[0]._M_dataplus._M_p != &local_548[0].field_2) {
        operator_delete(local_548[0]._M_dataplus._M_p,
                        (ulong)(local_548[0].field_2._M_allocated_capacity + 1));
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b8._8_8_);
      }
      if (*(uint32_t *)(local_5a0._0_8_ + 0x2e4) == 0) {
        CLI::App::_validate((App *)local_5a0._0_8_);
        CLI::App::_configure((App *)local_5a0._0_8_);
      }
      CLI::App::_parse_stream((App *)local_5a0._0_8_,(istream *)local_238);
      CLI::App::run_callback((App *)local_5a0._0_8_,false,false);
    }
    std::ifstream::~ifstream(local_238);
  }
  else {
    __s = (jsonString->_M_dataplus)._M_p;
    pvVar10 = memchr(__s,0x7b,jsonString->_M_string_length);
    if ((long)pvVar10 - (long)__s == -1 || pvVar10 == (void *)0x0) goto LAB_002e7a15;
    std::__cxx11::istringstream::istringstream
              ((istringstream *)local_238,(string *)jsonString,_S_in);
    uVar5 = local_5a0._0_8_;
    if (*(uint32_t *)(local_5a0._0_8_ + 0x2e4) == 0) {
      CLI::App::_validate((App *)local_5a0._0_8_);
      CLI::App::_configure((App *)uVar5);
    }
    CLI::App::_parse_stream((App *)uVar5,(istream *)local_238);
    CLI::App::run_callback((App *)uVar5,false,false);
    if (bVar2) {
      CLI::App::get_config_formatter_base((App *)local_3b8);
      uVar5 = local_3b8._0_8_;
      local_548[0]._M_dataplus._M_p = (pointer)&local_548[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_548,"helics","");
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(uVar5 + 0x30),
                local_548);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_548[0]._M_dataplus._M_p != &local_548[0].field_2) {
        operator_delete(local_548[0]._M_dataplus._M_p,
                        (ulong)(local_548[0].field_2._M_allocated_capacity + 1));
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b8._8_8_);
      }
      std::__cxx11::istringstream::istringstream
                ((istringstream *)local_548,(string *)jsonString,_S_in);
      uVar5 = local_5a0._0_8_;
      if (*(uint32_t *)(local_5a0._0_8_ + 0x2e4) == 0) {
        CLI::App::_validate((App *)local_5a0._0_8_);
        CLI::App::_configure((App *)uVar5);
      }
      CLI::App::_parse_stream((App *)uVar5,(istream *)local_548);
      CLI::App::run_callback((App *)uVar5,false,false);
      if (bVar11) {
        CLI::App::get_config_formatter_base((App *)local_578);
        uVar5 = local_578._0_8_;
        local_3b8._0_8_ = local_3a8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,"helics.helics","");
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (uVar5 + 0x30),
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b8);
        if ((pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_3b8._0_8_ != local_3a8) {
          operator_delete((void *)local_3b8._0_8_,(ulong)(local_3a8[0]._0_8_ + 1));
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_578._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_578._8_8_);
        }
        std::__cxx11::istringstream::istringstream
                  ((istringstream *)local_3b8,(string *)jsonString,_S_in);
        uVar5 = local_5a0._0_8_;
        if (*(uint32_t *)(local_5a0._0_8_ + 0x2e4) == 0) {
          CLI::App::_validate((App *)local_5a0._0_8_);
          CLI::App::_configure((App *)uVar5);
        }
        CLI::App::_parse_stream((App *)uVar5,(istream *)local_3b8);
        CLI::App::run_callback((App *)uVar5,false,false);
        std::__cxx11::istringstream::~istringstream((istringstream *)local_3b8);
        std::ios_base::~ios_base(local_340);
      }
      if (bVar12) {
        CLI::App::get_config_formatter_base((App *)local_578);
        local_3b8._0_8_ = local_3a8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,"helics.broker","");
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (local_578._0_8_ + 0x30),
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b8);
        if ((pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_3b8._0_8_ != local_3a8) {
          operator_delete((void *)local_3b8._0_8_,(ulong)(local_3a8[0]._0_8_ + 1));
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_578._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_578._8_8_);
        }
        std::__cxx11::istringstream::istringstream
                  ((istringstream *)local_3b8,(string *)jsonString,_S_in);
        uVar5 = local_5a0._0_8_;
        if (*(uint32_t *)(local_5a0._0_8_ + 0x2e4) == 0) {
          CLI::App::_validate((App *)local_5a0._0_8_);
          CLI::App::_configure((App *)uVar5);
        }
        CLI::App::_parse_stream((App *)uVar5,(istream *)local_3b8);
        CLI::App::run_callback((App *)uVar5,false,false);
        std::__cxx11::istringstream::~istringstream((istringstream *)local_3b8);
        std::ios_base::~ios_base(local_340);
      }
      std::__cxx11::istringstream::~istringstream((istringstream *)local_548);
      std::ios_base::~ios_base(local_4d0);
    }
    if ((char)local_58c._M_i != '\0') {
      CLI::App::get_config_formatter_base((App *)local_3b8);
      uVar5 = local_3b8._0_8_;
      local_548[0]._M_dataplus._M_p = (pointer)&local_548[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_548,"broker","");
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(uVar5 + 0x30),
                local_548);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_548[0]._M_dataplus._M_p != &local_548[0].field_2) {
        operator_delete(local_548[0]._M_dataplus._M_p,
                        (ulong)(local_548[0].field_2._M_allocated_capacity + 1));
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b8._8_8_);
      }
      std::__cxx11::istringstream::istringstream
                ((istringstream *)local_548,(string *)jsonString,_S_in);
      if (*(uint32_t *)(local_5a0._0_8_ + 0x2e4) == 0) {
        CLI::App::_validate((App *)local_5a0._0_8_);
        CLI::App::_configure((App *)local_5a0._0_8_);
      }
      CLI::App::_parse_stream((App *)local_5a0._0_8_,(istream *)local_548);
      CLI::App::run_callback((App *)local_5a0._0_8_,false,false);
      std::__cxx11::istringstream::~istringstream((istringstream *)local_548);
      std::ios_base::~ios_base(local_4d0);
    }
    std::__cxx11::istringstream::~istringstream((istringstream *)local_238);
    std::ios_base::~ios_base(local_1c0);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_550._M_p !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_550._M_p);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5a0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5a0._8_8_);
  }
LAB_002e8232:
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data(&local_588);
  return;
}

Assistant:

void BrokerBase::loadInfoFromJson(const std::string& jsonString, bool runArgParser)
{
    nlohmann::json doc;
    try {
        doc = fileops::loadJson(jsonString);
    }
    catch (const std::invalid_argument& iarg) {
        throw(helics::InvalidParameter(iarg.what()));
    }
    const bool hasHelicsSection = doc.contains("helics");
    bool hasHelicsSubSection{false};
    bool hasHelicsBrokerSubSection{false};
    if (hasHelicsSection) {
        hasHelicsSubSection = doc["helics"].contains("helics");
        hasHelicsBrokerSubSection = doc["helics"].contains("broker");
    }
    const bool hasBrokerSection = doc.contains("broker");

    if (runArgParser) {
        auto app = generateBaseCLI();
        auto sApp = generateCLI();
        app->add_subcommand(sApp);
        app->allow_extras();
        try {
            if (jsonString.find('{') != std::string::npos) {
                std::istringstream jstring(jsonString);
                app->parse_from_stream(jstring);
                if (hasHelicsSection) {
                    app->get_config_formatter_base()->section("helics");
                    std::istringstream jstringHelics(jsonString);
                    app->parse_from_stream(jstringHelics);
                    if (hasHelicsSubSection) {
                        app->get_config_formatter_base()->section("helics.helics");
                        std::istringstream jstringHelicsSub(jsonString);
                        app->parse_from_stream(jstringHelicsSub);
                    }
                    if (hasHelicsBrokerSubSection) {
                        app->get_config_formatter_base()->section("helics.broker");
                        std::istringstream jstringHelicsSub(jsonString);
                        app->parse_from_stream(jstringHelicsSub);
                    }
                }
                if (hasBrokerSection) {
                    app->get_config_formatter_base()->section("broker");
                    std::istringstream jstringBroker(jsonString);
                    app->parse_from_stream(jstringBroker);
                }
            } else {
                std::ifstream file(jsonString);
                app->parse_from_stream(file);
                if (hasHelicsSection) {
                    file.clear();
                    file.seekg(0);
                    app->get_config_formatter_base()->section("helics");
                    app->parse_from_stream(file);
                    if (hasHelicsSubSection) {
                        file.clear();
                        file.seekg(0);
                        app->get_config_formatter_base()->section("helics.helics");
                        app->parse_from_stream(file);
                    }
                    if (hasHelicsBrokerSubSection) {
                        file.clear();
                        file.seekg(0);
                        app->get_config_formatter_base()->section("helics.broker");
                        app->parse_from_stream(file);
                    }
                }
                if (hasBrokerSection) {
                    file.clear();
                    file.seekg(0);
                    app->get_config_formatter_base()->section("broker");
                    app->parse_from_stream(file);
                }
            }
        }
        catch (const CLI::Error& clierror) {
            throw(InvalidIdentifier(clierror.what()));
        }
    }
}